

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void load_rooms(FILE *fp)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  char cVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  ROOM_INDEX_DATA *pRVar7;
  char *pcVar8;
  TRACK_DATA *pTVar9;
  size_t sVar10;
  TRAP_DATA *pTVar11;
  FILE *in_RDI;
  __type _Var12;
  TRAP_DATA *trap;
  EXTRA_DESCR_DATA *ed;
  EXIT_DATA *pexit;
  size_t pRoomIndex_exit_size;
  int iHash;
  int door;
  long bitvect;
  char *bword;
  char letter;
  short vnum;
  int i;
  char error_v [4608];
  ROOM_INDEX_DATA *pRoomIndex;
  FILE *in_stack_00002d78;
  ulong in_stack_ffffffffffffed58;
  ROOM_INDEX_DATA *in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed68;
  int in_stack_ffffffffffffed6c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffed70;
  EXTRA_DESCR_DATA *in_stack_ffffffffffffed80;
  short *in_stack_ffffffffffffed90;
  EXIT_DATA *in_stack_ffffffffffffed98;
  size_t in_stack_ffffffffffffeda0;
  char *in_stack_ffffffffffffeda8;
  int local_1234;
  int local_121c;
  char local_1218 [4616];
  ROOM_INDEX_DATA *local_10;
  FILE *local_8;
  
  local_8 = in_RDI;
  if (area_last == (AREA_DATA_conflict *)0x0) {
    bugout("Load_resets: no #AREA seen yet.");
  }
  do {
    cVar1 = fread_letter((FILE *)in_stack_ffffffffffffed60);
    if (cVar1 != '#') {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffed70,
                 (char *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
      fmt._M_str = in_stack_ffffffffffffeda8;
      fmt._M_len = in_stack_ffffffffffffeda0;
      CLogger::Error<char&>
                ((CLogger *)in_stack_ffffffffffffed98,fmt,(char *)in_stack_ffffffffffffed90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffed70,
                 (char *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
      fmt_00._M_str = in_stack_ffffffffffffeda8;
      fmt_00._M_len = in_stack_ffffffffffffeda0;
      CLogger::Error<short&>((CLogger *)in_stack_ffffffffffffed98,fmt_00,in_stack_ffffffffffffed90);
      exit(0);
    }
    iVar5 = fread_number((FILE *)error_v._4336_8_);
    sVar3 = (short)iVar5;
    if (sVar3 == 0) {
      return;
    }
    fBootDb = false;
    pRVar7 = get_room_index(in_stack_ffffffffffffed6c);
    if (pRVar7 != (ROOM_INDEX_DATA *)0x0) {
      sprintf(local_1218,"Load_rooms: vnum %d duplicated.",(ulong)(uint)(int)sVar3);
      bugout(local_1218);
    }
    fBootDb = true;
    local_10 = (ROOM_INDEX_DATA *)operator_new(0x1c0);
    local_10->reset_first = (RESET_DATA *)0x0;
    local_10->reset_last = (RESET_DATA *)0x0;
    pcVar8 = (char *)palloc_string("");
    local_10->owner = pcVar8;
    local_10->move_progs = false;
    local_10->people = (CHAR_DATA *)0x0;
    local_10->contents = (OBJ_DATA *)0x0;
    local_10->extra_descr = (EXTRA_DESCR_DATA *)0x0;
    local_10->alt_description = (char *)0x0;
    local_10->alt_description_cond = 0;
    local_10->alt_name = (char *)0x0;
    local_10->trap = (TRAP_DATA *)0x0;
    local_10->affected = (ROOM_AFFECT_DATA *)0x0;
    zero_vector(local_10->room_flags);
    for (local_121c = 0; local_121c < 4; local_121c = local_121c + 1) {
      pTVar9 = (TRACK_DATA *)new_track_data();
      local_10->tracks[local_121c] = pTVar9;
    }
    local_10->area = area_last;
    local_10->vnum = sVar3;
    pcVar8 = fread_string(in_stack_00002d78);
    local_10->name = pcVar8;
    in_stack_ffffffffffffed70 = (basic_string_view<char,_std::char_traits<char>_> *)local_10->name;
    sVar10 = strlen(local_10->name);
    if (*(char *)((long)in_stack_ffffffffffffed70 + (sVar10 - 1)) == '.') {
      chop(local_10->name);
    }
    pcVar8 = fread_string(in_stack_00002d78);
    local_10->description = pcVar8;
    pcVar8 = fread_word((FILE *)in_stack_ffffffffffffed80);
    iVar5 = sect_lookup(pcVar8);
    local_10->sector_type = (short)*(undefined4 *)(std::ofstream::~ofstream + (long)iVar5 * 0x18);
    local_10->rprogs = (RPROG_DATA *)0x0;
    zero_vector(local_10->progtypes);
    local_10->cabal = 0;
    local_10->has_rune = false;
    zero_vector(local_10->affected_by);
    if (local_10->area->area_type == 6) {
      _Var12 = std::pow<int,int>(0,0x1da796);
      local_10->room_flags[0] = (long)_Var12 | local_10->room_flags[0];
      _Var12 = std::pow<int,int>(0,0x1da7c0);
      local_10->room_flags[0] = (long)_Var12 | local_10->room_flags[0];
      _Var12 = std::pow<int,int>(0,0x1da7ea);
      local_10->room_flags[0] = (long)_Var12 | local_10->room_flags[0];
    }
    in_stack_ffffffffffffeda0 = std::size<exit_data*,6ul>((exit_data *(*) [6])local_10->exit);
    for (local_1234 = 0; (ulong)(long)local_1234 < in_stack_ffffffffffffeda0;
        local_1234 = local_1234 + 1) {
      local_10->exit[local_1234] = (EXIT_DATA *)0x0;
    }
    local_10->heal_rate = 100;
    local_10->mana_rate = 100;
    local_10->light = 0;
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        cVar1 = fread_letter((FILE *)in_stack_ffffffffffffed60);
                        if ((cVar1 < 'a') || ('z' < cVar1)) {
                          in_stack_ffffffffffffed6c = (int)cVar1;
                        }
                        else {
                          in_stack_ffffffffffffed6c = cVar1 + -0x20;
                        }
                        cVar1 = (char)in_stack_ffffffffffffed6c;
                        if (cVar1 == 'S') goto LAB_001daeab;
                        if (cVar1 != 'H') break;
                        iVar5 = fread_number((FILE *)error_v._4336_8_);
                        local_10->heal_rate = (short)iVar5;
                      }
                      if (cVar1 != 'M') break;
                      iVar5 = fread_number((FILE *)error_v._4336_8_);
                      local_10->mana_rate = (short)iVar5;
                    }
                    if (cVar1 != 'G') break;
                    iVar5 = fread_number((FILE *)error_v._4336_8_);
                    local_10->guild = (short)iVar5;
                  }
                  if (cVar1 != 'A') break;
                  fread_word((FILE *)in_stack_ffffffffffffed80);
                  iVar5 = fread_number((FILE *)error_v._4336_8_);
                  local_10->alt_description_cond = (short)iVar5;
                  pcVar8 = fread_string(in_stack_00002d78);
                  local_10->alt_name = pcVar8;
                  pcVar8 = fread_string(in_stack_00002d78);
                  local_10->alt_description = pcVar8;
                }
                if (cVar1 != 'C') break;
                fread_word((FILE *)in_stack_ffffffffffffed80);
                if (local_10->cabal != 0) {
                  bugout("Load_rooms: duplicate cabal fields.");
                }
                pcVar8 = fread_word((FILE *)in_stack_ffffffffffffed80);
                sVar4 = cabal_lookup(pcVar8);
                local_10->cabal = sVar4;
              }
              if (cVar1 != 'D') break;
              pcVar8 = fread_word((FILE *)in_stack_ffffffffffffed80);
              iVar5 = flag_lookup(pcVar8,(flag_type *)&direction_table);
              if ((iVar5 < 0) || (5 < iVar5)) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_ffffffffffffed70,
                           (char *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
                fmt_01._M_str = in_stack_ffffffffffffeda8;
                fmt_01._M_len = in_stack_ffffffffffffeda0;
                CLogger::Error<short&>
                          ((CLogger *)in_stack_ffffffffffffed98,fmt_01,in_stack_ffffffffffffed90);
                exit(1);
              }
              in_stack_ffffffffffffed98 = (EXIT_DATA *)operator_new(0x50);
              iVar6 = fread_number((FILE *)error_v._4336_8_);
              (in_stack_ffffffffffffed98->u1).vnum = (short)iVar6;
              fread_flag_new((long *)in_stack_ffffffffffffed70,
                             (FILE *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
              iVar6 = fread_number((FILE *)error_v._4336_8_);
              in_stack_ffffffffffffed98->key = (short)iVar6;
              pcVar8 = fread_string(in_stack_00002d78);
              in_stack_ffffffffffffed98->keyword = pcVar8;
              pcVar8 = fread_string(in_stack_00002d78);
              in_stack_ffffffffffffed98->description = pcVar8;
              local_10->exit[iVar5] = in_stack_ffffffffffffed98;
              top_exit = top_exit + 1;
            }
            if (cVar1 != 'E') break;
            in_stack_ffffffffffffed80 = (EXTRA_DESCR_DATA *)operator_new(0x20);
            pcVar8 = fread_string(in_stack_00002d78);
            in_stack_ffffffffffffed80->keyword = pcVar8;
            pcVar8 = fread_string(in_stack_00002d78);
            in_stack_ffffffffffffed80->description = pcVar8;
            in_stack_ffffffffffffed80->next = local_10->extra_descr;
            local_10->extra_descr = in_stack_ffffffffffffed80;
            top_ed = top_ed + 1;
          }
          if (cVar1 != 'T') break;
          fread_word((FILE *)in_stack_ffffffffffffed80);
          pTVar11 = (TRAP_DATA *)new_trap();
          pTVar11->room = local_10;
          pcVar8 = fread_word((FILE *)in_stack_ffffffffffffed80);
          iVar5 = flag_lookup(pcVar8,(flag_type *)&trap_table);
          pTVar11->type = iVar5;
          iVar5 = fread_number((FILE *)error_v._4336_8_);
          pTVar11->quality = iVar5;
          if (10 < pTVar11->quality) {
            pTVar11->quality = 10;
          }
          iVar5 = fread_number((FILE *)error_v._4336_8_);
          pTVar11->complexity = iVar5;
          iVar5 = fread_number((FILE *)error_v._4336_8_);
          pTVar11->timer = iVar5;
          if (pTVar11->timer < 0) {
            pTVar11->timer = 0;
          }
          pcVar8 = fread_string(in_stack_00002d78);
          pTVar11->trig_echo = pcVar8;
          pcVar8 = fread_string(in_stack_00002d78);
          pTVar11->exec_echo = pcVar8;
          pTVar11->armed = true;
          local_10->trap = pTVar11;
        }
        if (cVar1 != 'O') break;
        fread_word((FILE *)in_stack_ffffffffffffed80);
        if (*local_10->owner != '\0') {
          bugout("Load_rooms: duplicate owner.");
        }
        pcVar8 = fread_string(in_stack_00002d78);
        local_10->owner = pcVar8;
      }
      if (cVar1 != 'R') break;
      fread_word((FILE *)in_stack_ffffffffffffed80);
      iVar6 = (int)((ulong)in_stack_ffffffffffffed60 >> 0x20);
      pcVar8 = fread_word((FILE *)in_stack_ffffffffffffed80);
      iVar5 = flag_lookup(pcVar8,(flag_type *)&room_flags);
      if ((iVar5 == -99) && (bVar2 = str_cmp(pcVar8,"dark"), bVar2)) {
        bugout("Invalid bitvector specified for room flags.");
      }
      _Var12 = std::pow<int,long>(iVar6,in_stack_ffffffffffffed58);
      in_stack_ffffffffffffed58 = (ulong)_Var12;
      local_10->room_flags[iVar5 / 0x20] =
           in_stack_ffffffffffffed58 | local_10->room_flags[iVar5 / 0x20];
      in_stack_ffffffffffffed60 = local_10;
    }
    ungetc((int)cVar1,local_8);
LAB_001daeab:
    local_10->next = room_index_hash[(int)sVar3 % 0x400];
    room_index_hash[(int)sVar3 % 0x400] = local_10;
    local_10->next_room = room_list;
    room_list = local_10;
    top_room = top_room + 1;
  } while( true );
}

Assistant:

void load_rooms(FILE *fp)
{
	ROOM_INDEX_DATA *pRoomIndex;
	char error_v[MAX_STRING_LENGTH];
	int i;

	if (area_last == nullptr)
		bugout("Load_resets: no #AREA seen yet.");

	for (;;)
	{
		short vnum = 0;
		char letter;
		char *bword;
		long bitvect;
		int door;
		int iHash;

		letter = fread_letter(fp);
		if (letter != '#')
		{
			RS.Logger.Error("Letter is {}.", letter);
			RS.Logger.Error("Load_newrooms: # not found, last vnum {}.", vnum);
			exit(0);
		}

		vnum = fread_number(fp);
		if (vnum == 0)
			break;

		fBootDb= false;

		if (get_room_index(vnum) != nullptr)
		{
			sprintf(error_v, "Load_rooms: vnum %d duplicated.", vnum);
			bugout(error_v);
		}

		fBootDb = true;

		pRoomIndex = new ROOM_INDEX_DATA;
		pRoomIndex->reset_first = nullptr;
		pRoomIndex->reset_last = nullptr;
		pRoomIndex->owner = palloc_string("");
		pRoomIndex->move_progs= false;
		pRoomIndex->people = nullptr;
		pRoomIndex->contents = nullptr;
		pRoomIndex->extra_descr = nullptr;
		pRoomIndex->alt_description = nullptr;
		pRoomIndex->alt_description_cond = 0;
		pRoomIndex->alt_name = nullptr;
		pRoomIndex->trap = nullptr;
		pRoomIndex->affected = nullptr;
		zero_vector(pRoomIndex->room_flags);

		for (i = 0; i < MAX_TRACKS; i++)
		{
			pRoomIndex->tracks[i] = new_track_data();
		}

		pRoomIndex->area = area_last;
		pRoomIndex->vnum = vnum;
		pRoomIndex->name = fread_string(fp);

		if (pRoomIndex->name[strlen(pRoomIndex->name) - 1] == '.')
			chop(pRoomIndex->name);

		pRoomIndex->description = fread_string(fp);
		pRoomIndex->sector_type = sect_table[sect_lookup(fread_word(fp))].value;

		/* Morg - Valgrind fix. */
		pRoomIndex->rprogs = nullptr;
		zero_vector(pRoomIndex->progtypes);
		pRoomIndex->cabal = 0;
		pRoomIndex->has_rune= false;

		zero_vector(pRoomIndex->affected_by);
		if (pRoomIndex->area->area_type == ARE_SHRINE)
		{
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_TO);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_SUMMON_FROM);
			SET_BIT(pRoomIndex->room_flags, ROOM_NO_GATE);
		}

		auto pRoomIndex_exit_size = std::size(pRoomIndex->exit);
		for (door = 0; door < pRoomIndex_exit_size; door++)
		{
			pRoomIndex->exit[door] = nullptr;
		}

		/* defaults */
		pRoomIndex->heal_rate = 100;
		pRoomIndex->mana_rate = 100;
		pRoomIndex->light = 0;

		for (;;)
		{
			letter = fread_letter(fp);
			letter = UPPER(letter);
			if (letter == 'S')
				break;

			if (letter == 'H') /* healing room */
				pRoomIndex->heal_rate = fread_number(fp);
			else if (letter == 'M') /* mana room */
				pRoomIndex->mana_rate = fread_number(fp);
			else if (letter == 'G') /* Guilds...added by Ceran */
				pRoomIndex->guild = fread_number(fp);
			else if (letter == 'A') // ALTDESC
			{
				fread_word(fp);
				pRoomIndex->alt_description_cond = fread_number(fp);
				pRoomIndex->alt_name = fread_string(fp);
				pRoomIndex->alt_description = fread_string(fp);
			}
			else if (letter == 'C') /* Cabal */
			{
				fread_word(fp);
				if (pRoomIndex->cabal)
					bugout("Load_rooms: duplicate cabal fields.");
				pRoomIndex->cabal = cabal_lookup(fread_word(fp));
			}
			else if (letter == 'D')
			{
				EXIT_DATA *pexit;

				door = flag_lookup(fread_word(fp), direction_table);
				if (door < 0 || door > 5)
				{
					RS.Logger.Error("Fread_rooms: vnum {} has bad door number.", vnum);
					exit(1);
				}

				pexit = new EXIT_DATA;
				pexit->u1.vnum = fread_number(fp);
				fread_flag_new(pexit->exit_info, fp);
				pexit->key = fread_number(fp);
				pexit->keyword = fread_string(fp);
				pexit->description = fread_string(fp);

				pRoomIndex->exit[door] = pexit;
				top_exit++;
			}
			else if (letter == 'E')
			{
				EXTRA_DESCR_DATA *ed;

				ed = new EXTRA_DESCR_DATA;
				ed->keyword = fread_string(fp);
				ed->description = fread_string(fp);
				ed->next = pRoomIndex->extra_descr;
				pRoomIndex->extra_descr = ed;
				top_ed++;
			}
			else if (letter == 'T')
			{
				TRAP_DATA *trap;
				fread_word(fp);

				trap = new_trap();
				trap->room = pRoomIndex;
				trap->type = flag_lookup(fread_word(fp), trap_table);
				trap->quality = fread_number(fp);

				if (trap->quality > 10)
					trap->quality = 10;

				trap->complexity = fread_number(fp);
				trap->timer = fread_number(fp);

				if (trap->timer < 0)
					trap->timer = 0;

				trap->trig_echo = fread_string(fp);
				trap->exec_echo = fread_string(fp);
				trap->armed = true;
				pRoomIndex->trap = trap;
			}
			else if (letter == 'O')
			{
				fread_word(fp);

				if (pRoomIndex->owner[0] != '\0')
					bugout("Load_rooms: duplicate owner.");

				pRoomIndex->owner = fread_string(fp);
			}
			else if (letter == 'R')
			{
				fread_word(fp);
				bword = fread_word(fp);
				bitvect = flag_lookup(bword, room_flags);
				if (bitvect == NO_FLAG && str_cmp(bword, "dark"))
					bugout("Invalid bitvector specified for room flags.");
				SET_BIT(pRoomIndex->room_flags, bitvect);
			}
			else
			{
				ungetc(letter, fp);
				break;
			}
		}

		iHash = vnum % MAX_KEY_HASH;
		pRoomIndex->next = room_index_hash[iHash];
		room_index_hash[iHash] = pRoomIndex;
		pRoomIndex->next_room = room_list;
		room_list = pRoomIndex;
		top_room++;
	}
}